

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O2

ON_3dVector * __thiscall ON_Line::Direction(ON_3dVector *__return_storage_ptr__,ON_Line *this)

{
  double dVar1;
  bool bVar2;
  ON_3dVector *pOVar3;
  
  if ((ABS((this->to).x) < 1.23432101234321e+308) && (ABS((this->from).x) < 1.23432101234321e+308))
  {
    ON_3dPoint::operator-(__return_storage_ptr__,&this->to,&this->from);
    return __return_storage_ptr__;
  }
  bVar2 = ON_3dPoint::operator==(&ON_3dPoint::UnsetPoint,&this->from);
  if ((bVar2) && (bVar2 = ON_3dPoint::operator==(&ON_3dPoint::UnsetPoint,&this->to), bVar2)) {
    pOVar3 = &ON_3dVector::UnsetVector;
  }
  else {
    pOVar3 = &ON_3dVector::NanVector;
  }
  __return_storage_ptr__->z = pOVar3->z;
  dVar1 = pOVar3->y;
  __return_storage_ptr__->x = pOVar3->x;
  __return_storage_ptr__->y = dVar1;
  return __return_storage_ptr__;
}

Assistant:

ON_3dVector ON_Line::Direction() const
{
  return (ON_UNSET_VALUE < to.x && to.x < ON_UNSET_POSITIVE_VALUE && ON_UNSET_VALUE <from.x && from.x < ON_UNSET_POSITIVE_VALUE) 
    ? (to-from)
    : (ON_3dPoint::UnsetPoint == from && ON_3dPoint::UnsetPoint == to ? ON_3dVector::UnsetVector : ON_3dVector::NanVector)
    ;
}